

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

int message_lookup_by_sound_name(char *name)

{
  wchar_t wVar1;
  ulong local_20;
  size_t i;
  char *name_local;
  
  local_20 = 0;
  while( true ) {
    if (0x9b < local_20) {
      return 0;
    }
    wVar1 = my_stricmp(name,message_lookup_by_sound_name::sound_names[local_20]);
    if (wVar1 == L'\0') break;
    local_20 = local_20 + 1;
  }
  return (int)local_20;
}

Assistant:

int message_lookup_by_sound_name(const char *name)
{
	static const char *sound_names[] = {
		#define MSG(x, s) s,
		#include "list-message.h"
		#undef MSG
	};
	size_t i;

	/* Exclude MSG_MAX since it has NULL for the sound's name. */
	for (i = 0; i < N_ELEMENTS(sound_names) - 1; i++) {
		if (my_stricmp(name, sound_names[i]) == 0)
			return (int)i;
	}

	return MSG_GENERIC;
}